

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.cpp
# Opt level: O1

uint16_t TileData::rowBitplanes(Tile *tile,Palette *palette,uint32_t y)

{
  byte bVar1;
  byte bVar2;
  uint16_t color;
  undefined8 in_RAX;
  ushort uVar3;
  int iVar4;
  undefined8 uStack_38;
  
  uVar3 = 0;
  iVar4 = 0;
  uStack_38 = in_RAX;
  do {
    uStack_38 = CONCAT44((tile->_png->pixels).
                         super__Vector_base<Rgba,_default_init_allocator<Rgba,_std::allocator<Rgba>_>_>
                         ._M_impl.super__Vector_impl_data._M_start
                         [(tile->y + y) * tile->_png->width + tile->x + iVar4],(undefined4)uStack_38
                        );
    color = Rgba::cgbColor((Rgba *)((long)&uStack_38 + 4));
    bVar1 = Palette::indexOf(palette,color);
    bVar2 = Palette::size(palette);
    if (bVar2 <= bVar1) {
      __assert_fail("index < palette.size()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/gfx/process.cpp"
                    ,0x2a9,"rowBitplanes");
    }
    uVar3 = (ushort)(bVar1 & 2) << 7 | (ushort)(bVar1 & 1) + uVar3 * 2;
    iVar4 = iVar4 + 1;
  } while (iVar4 != 8);
  return uVar3;
}

Assistant:

static uint16_t rowBitplanes(Png::TilesVisitor::Tile const &tile, Palette const &palette,
	                             uint32_t y) {
		uint16_t row = 0;
		for (uint32_t x = 0; x < 8; ++x) {
			row <<= 1;
			uint8_t index = palette.indexOf(tile.pixel(x, y).cgbColor());
			assert(index < palette.size()); // The color should be in the palette
			if (index & 1) {
				row |= 1;
			}
			if (index & 2) {
				row |= 0x100;
			}
		}
		return row;
	}